

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall
cppcms::application::url
          (application *this,string *key,streamable *p1,streamable *p2,streamable *p3,streamable *p4
          )

{
  context *this_00;
  streamable *p3_00;
  string *in_RSI;
  streamable *in_RDI;
  ostringstream ss;
  context *in_stack_fffffffffffffe08;
  streamable *p1_00;
  ostream *out;
  streamable *in_stack_fffffffffffffe40;
  application *in_stack_fffffffffffffe48;
  locale local_1b0 [8];
  long local_1a8 [53];
  
  p1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  out = (ostream *)((long)local_1a8 + *(long *)(local_1a8[0] + -0x18));
  this_00 = context(in_stack_fffffffffffffe48);
  http::context::locale(in_stack_fffffffffffffe08);
  std::ios::imbue(local_1b0);
  std::locale::~locale(local_1b0);
  std::locale::~locale((locale *)&stack0xfffffffffffffe48);
  p3_00 = (streamable *)mapper((application *)0x3b1bcc);
  url_mapper::map((url_mapper *)this_00,out,in_RSI,p1_00,in_RDI,p3_00,in_stack_fffffffffffffe40);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return (string *)p1_00;
}

Assistant:

std::string application::url(	std::string const &key,
				filters::streamable const &p1,
				filters::streamable const &p2,
				filters::streamable const &p3,
				filters::streamable const &p4)
{
	std::ostringstream ss;
	ss.imbue(context().locale());
	mapper().map(ss,key,p1,p2,p3,p4);
	return ss.str();
}